

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_default_nan_arm(float_status *status)

{
  float128 fVar1;
  FloatParts FVar2;
  undefined8 local_30;
  FloatParts p;
  float_status *status_local;
  float128 r;
  
  FVar2 = parts_default_nan(status);
  local_30 = FVar2.frac;
  r.low._0_6_ = (undefined6)(local_30 >> 0xe);
  p.frac._5_1_ = FVar2.sign;
  r.low._6_2_ = (ushort)(((ulong)p.frac._5_1_ << 0x3f) >> 0x30) | 0x7fff;
  fVar1.high._0_6_ = (undefined6)r.low;
  fVar1.low = -(ulong)((uint)FVar2.frac & 1);
  fVar1.high._6_2_ = r.low._6_2_;
  return fVar1;
}

Assistant:

float128 float128_default_nan(float_status *status)
{
    FloatParts p = parts_default_nan(status);
    float128 r;

    /* Extrapolate from the choices made by parts_default_nan to fill
     * in the quad-floating format.  If the low bit is set, assume we
     * want to set all non-snan bits.
     */
#ifdef _MSC_VER
    r.low = 0ULL - (p.frac & 1);
#else
    r.low = -(p.frac & 1);
#endif
    r.high = p.frac >> (DECOMPOSED_BINARY_POINT - 48);
    r.high |= UINT64_C(0x7FFF000000000000);
    r.high |= (uint64_t)p.sign << 63;

    return r;
}